

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O2

void __thiscall soul::RenderingVenue::Pimpl::removeActiveSession(Pimpl *this,SessionImpl *session)

{
  anon_class_8_1_f9aab576_for__M_pred local_20;
  
  std::mutex::lock(&this->sessionListLock);
  local_20.session = session;
  removeIf<std::vector<soul::RenderingVenue::Pimpl::SessionImpl*,std::allocator<soul::RenderingVenue::Pimpl::SessionImpl*>>,soul::RenderingVenue::Pimpl::removeActiveSession(soul::RenderingVenue::Pimpl::SessionImpl&)::_lambda(soul::RenderingVenue::Pimpl::SessionImpl*)_1_>
            (&this->activeSessions,&local_20);
  pthread_mutex_unlock((pthread_mutex_t *)&this->sessionListLock);
  return;
}

Assistant:

void removeActiveSession (SessionImpl& session)
    {
        std::lock_guard<std::mutex> l (sessionListLock);
        removeIf (activeSessions, [&] (SessionImpl* s) { return s == std::addressof (session); });
    }